

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O2

string * custom_text(string *__return_storage_ptr__,string *text,int color)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,color);
  std::operator+(&bStack_98,"\x1b[38;5;",&local_38);
  std::operator+(&local_78,&bStack_98,"m");
  std::operator+(&local_58,&local_78,text);
  std::operator+(__return_storage_ptr__,&local_58,"\x1b[37m");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string custom_text(string text,int color){
	return "\033[38;5;"+to_string(color)+"m" + text + "\033[37m";
	}